

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_update3_cc(DisasContext *s,TCGv_i64 reg)

{
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_mov_i64_x86_64(tcg_ctx,tcg_ctx->cpu_cc_src2,reg);
  tcg_gen_mov_i64_x86_64(tcg_ctx,tcg_ctx->cpu_cc_src,s->T1);
  tcg_gen_mov_i64_x86_64(tcg_ctx,tcg_ctx->cpu_cc_dst,s->T0);
  return;
}

Assistant:

static void gen_op_update3_cc(DisasContext *s, TCGv reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src2, reg);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, s->T1);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, s->T0);
}